

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_scale_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_23415c::ResizeAndExtendTest::RunTest
          (ResizeAndExtendTest *this,InterpFilter filter_type)

{
  uint src_height;
  uint src_width;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  pointer *__ptr;
  int dst_height;
  undefined7 in_register_00000031;
  SEARCH_METHODS *pSVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int dst_width;
  int in_stack_ffffffffffffff28;
  undefined4 uStack_d4;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_a0;
  int local_94;
  uint local_90;
  int local_8c;
  int local_88;
  uint local_84;
  ulong local_80;
  long local_78;
  long local_70;
  ResizeAndExtendTest *local_68;
  size_t *local_60;
  size_t *local_58;
  YV12_BUFFER_CONFIG *local_50;
  YV12_BUFFER_CONFIG *local_48;
  YV12_BUFFER_CONFIG *local_40;
  long local_38;
  
  local_40 = &this->img_;
  local_48 = &this->ref_img_;
  local_50 = &this->dst_img_;
  local_58 = &(this->ref_img_).frame_size;
  local_60 = &(this->dst_img_).frame_size;
  lVar7 = 0;
  local_68 = this;
  do {
    if (lVar7 == 2) {
      return;
    }
    local_94 = RunTest::kDstBorders[lVar7];
    for (uVar14 = 0; local_90 = (uint)uVar14, local_90 != 0x10; uVar14 = (ulong)((int)uVar14 + 1)) {
      for (lVar8 = 0; lVar8 != 0x16; lVar8 = lVar8 + 1) {
        src_height = RunTest::kSizesToTest[lVar8];
        local_78 = lVar8;
        for (local_70 = 0; local_70 != 0x16; local_70 = local_70 + 1) {
          src_width = RunTest::kSizesToTest[local_70];
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            uVar1 = RunTest::kScaleFactors[lVar10];
            uVar11 = (ulong)uVar1;
            iVar12 = uVar1 * src_width;
            iVar13 = uVar1 * src_height;
            local_8c = iVar13;
            local_88 = iVar12;
            local_80 = uVar11;
            local_38 = lVar10;
            for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
              uVar1 = *(uint *)((long)RunTest::kScaleFactors + lVar8);
              uVar2 = (long)iVar12 / (long)(int)uVar1;
              uVar3 = (long)iVar13 / (long)(int)uVar1;
              if (((((lVar8 != 0xc || lVar10 != 2) && (lVar10 == 0 || (uint)uVar11 != uVar1)) &&
                   ((uVar2 & 1) == 0)) &&
                  ((dst_width = (int)uVar2, dst_width != 0 &&
                   (dst_height = (int)uVar3, dst_height != 0)))) &&
                 (((uVar3 & 1) == 0 &&
                  ((src_width == dst_width * 4 ||
                    SBORROW4(src_width,dst_width * 4) != (int)(src_width + dst_width * -4) < 0 &&
                   (src_height == dst_height * 4 ||
                    SBORROW4(src_height,dst_height * 4) != (int)(src_height + dst_height * -4) < 0))
                  )))) {
                bVar6 = testing::internal::AlwaysTrue();
                if (!bVar6) {
LAB_00430b3c:
                  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff28,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x85,
                             "Expected: ResetResizeImages( src_width, src_height, dst_width, dst_height, dst_border) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                            );
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xffffffffffffff28,
                             (Message *)&gtest_fatal_failure_checker);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff28);
                  if ((long *)CONCAT71(gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface._1_7_,
                                       (char)gtest_fatal_failure_checker.
                                             super_TestPartResultReporterInterface.
                                             _vptr_TestPartResultReporterInterface) == (long *)0x0)
                  {
                    return;
                  }
                  (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.
                                                 super_TestPartResultReporterInterface.
                                                 _vptr_TestPartResultReporterInterface._1_7_,
                                                 (char)gtest_fatal_failure_checker.
                                                       super_TestPartResultReporterInterface.
                                                       _vptr_TestPartResultReporterInterface) + 8))
                            ();
                  return;
                }
                testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                          (&gtest_fatal_failure_checker);
                bVar6 = testing::internal::AlwaysTrue();
                if (bVar6) {
                  ResetResizeImages(this,src_width,src_height,dst_width,dst_height,local_94);
                }
                bVar6 = gtest_fatal_failure_checker.has_new_fatal_failure_;
                testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                          (&gtest_fatal_failure_checker);
                pYVar5 = local_40;
                uVar4 = local_90;
                if (bVar6 == true) goto LAB_00430b3c;
                local_84 = (uint)CONCAT71(in_register_00000031,filter_type) & 0xff;
                uVar14 = (ulong)local_90;
                av1_resize_and_extend_frame_c(local_40,local_48,filter_type,local_90,1);
                this = local_68;
                (*local_68->resize_fn_)(pYVar5,local_50,(InterpFilter)local_84,uVar4,1);
                iVar12 = bcmp((this->dst_img_).buffer_alloc,(this->ref_img_).buffer_alloc,
                              (this->ref_img_).frame_size);
                if (iVar12 != 0) {
                  printf("filter_type = %d, phase_scaler = %d, src_width = %4d, src_height = %4d, dst_width = %4d, dst_height = %4d, scale factor = %d:%d\n"
                         ,CONCAT71(in_register_00000031,filter_type) & 0xffffffff,uVar14,
                         (ulong)src_width,(ulong)src_height,uVar2 & 0xffffffff,uVar3 & 0xffffffff,
                         (ulong)uVar1,local_80);
                  iVar12 = bcmp((this->dst_img_).buffer_alloc,(this->ref_img_).buffer_alloc,
                                (this->ref_img_).frame_size);
                  if (iVar12 != 0) {
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.y_buffer,
                                       (this->dst_img_).field_5.field_0.y_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.y_stride,
                                       (this->ref_img_).field_0.field_0.y_width,
                                       (this->ref_img_).field_1.field_0.y_height,0,
                                       in_stack_ffffffffffffff28);
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.u_buffer,
                                       (this->dst_img_).field_5.field_0.u_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.uv_stride,
                                       (this->ref_img_).field_0.field_0.uv_width,
                                       (this->ref_img_).field_1.field_0.uv_height,1,
                                       in_stack_ffffffffffffff28);
                    PrintDiffComponent((ResizeAndExtendTest *)
                                       (this->ref_img_).field_5.field_0.v_buffer,
                                       (this->dst_img_).field_5.field_0.v_buffer,
                                       (uint8_t *)
                                       (ulong)(uint)(this->ref_img_).field_4.field_0.uv_stride,
                                       (this->ref_img_).field_0.field_0.uv_width,
                                       (this->ref_img_).field_1.field_0.uv_height,2,
                                       in_stack_ffffffffffffff28);
                  }
                }
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)&gtest_fatal_failure_checker,"ref_img_.frame_size",
                           "dst_img_.frame_size",local_58,local_60);
                if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                          _vptr_TestPartResultReporterInterface == '\0') {
                  testing::Message::Message((Message *)&stack0xffffffffffffff28);
                  pSVar9 = "";
                  if ((undefined8 *)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_) !=
                      (undefined8 *)0x0) {
                    pSVar9 = *(SEARCH_METHODS **)
                              CONCAT71(gtest_fatal_failure_checker._9_7_,
                                       gtest_fatal_failure_checker.has_new_fatal_failure_);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x96,(char *)pSVar9);
                  testing::internal::AssertHelper::operator=
                            (&local_a0,(Message *)&stack0xffffffffffffff28);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  if ((long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
                in_stack_ffffffffffffff28 = 0;
                local_a0.data_._0_4_ =
                     memcmp((this->ref_img_).buffer_alloc,(this->dst_img_).buffer_alloc,
                            (this->ref_img_).frame_size);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_fatal_failure_checker,"0",
                           "memcmp(ref_img_.buffer_alloc, dst_img_.buffer_alloc, ref_img_.frame_size)"
                           ,(int *)&stack0xffffffffffffff28,(int *)&local_a0);
                if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                          _vptr_TestPartResultReporterInterface == '\0') {
                  testing::Message::Message((Message *)&stack0xffffffffffffff28);
                  pSVar9 = "";
                  if ((undefined8 *)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_) !=
                      (undefined8 *)0x0) {
                    pSVar9 = *(SEARCH_METHODS **)
                              CONCAT71(gtest_fatal_failure_checker._9_7_,
                                       gtest_fatal_failure_checker.has_new_fatal_failure_);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_scale_test.cc"
                             ,0x99,(char *)pSVar9);
                  testing::internal::AssertHelper::operator=
                            (&local_a0,(Message *)&stack0xffffffffffffff28);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  if ((long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(uStack_d4,in_stack_ffffffffffffff28) + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
                DeallocResizeImages(this);
                lVar10 = local_38;
                uVar11 = local_80;
                iVar12 = local_88;
                iVar13 = local_8c;
              }
            }
            lVar8 = local_78;
          }
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void RunTest(InterpFilter filter_type) {
    static const int kNumSizesToTest = 22;
    static const int kNumScaleFactorsToTest = 4;
    static const int kNumDstBordersToTest = 2;
    static const int kSizesToTest[] = { 1,  2,  3,  4,  6,   8,  10, 12,
                                        14, 16, 18, 20, 22,  24, 26, 28,
                                        30, 32, 34, 68, 128, 134 };
    static const int kScaleFactors[] = { 1, 2, 3, 4 };
    static const int kDstBorders[] = { 0, AOM_BORDER_IN_PIXELS };
    for (int border = 0; border < kNumDstBordersToTest; ++border) {
      const int dst_border = kDstBorders[border];
      for (int phase_scaler = 0; phase_scaler < 16; ++phase_scaler) {
        for (int h = 0; h < kNumSizesToTest; ++h) {
          const int src_height = kSizesToTest[h];
          for (int w = 0; w < kNumSizesToTest; ++w) {
            const int src_width = kSizesToTest[w];
            for (int sf_up_idx = 0; sf_up_idx < kNumScaleFactorsToTest;
                 ++sf_up_idx) {
              const int sf_up = kScaleFactors[sf_up_idx];
              for (int sf_down_idx = 0; sf_down_idx < kNumScaleFactorsToTest;
                   ++sf_down_idx) {
                const int sf_down = kScaleFactors[sf_down_idx];
                const int dst_width = src_width * sf_up / sf_down;
                const int dst_height = src_height * sf_up / sf_down;
                // TODO: bug aomedia:363916152 - Enable unit tests for 4 to 3
                // scaling when Neon and SSSE3 implementation of
                // av1_resize_and_extend_frame do not differ from scalar version
                if (sf_down == 4 && sf_up == 3) {
                  continue;
                }

                if (sf_up == sf_down && sf_up != 1) {
                  continue;
                }
                // I420 frame width and height must be even.
                if (!dst_width || !dst_height || dst_width & 1 ||
                    dst_height & 1) {
                  continue;
                }
                // aom_convolve8_c() has restriction on the step which cannot
                // exceed 64 (ratio 1 to 4).
                if (src_width > 4 * dst_width || src_height > 4 * dst_height) {
                  continue;
                }
                ASSERT_NO_FATAL_FAILURE(ResetResizeImages(
                    src_width, src_height, dst_width, dst_height, dst_border));

                av1_resize_and_extend_frame_c(&img_, &ref_img_, filter_type,
                                              phase_scaler, 1);
                resize_fn_(&img_, &dst_img_, filter_type, phase_scaler, 1);

                if (memcmp(dst_img_.buffer_alloc, ref_img_.buffer_alloc,
                           ref_img_.frame_size)) {
                  printf(
                      "filter_type = %d, phase_scaler = %d, src_width = %4d, "
                      "src_height = %4d, dst_width = %4d, dst_height = %4d, "
                      "scale factor = %d:%d\n",
                      filter_type, phase_scaler, src_width, src_height,
                      dst_width, dst_height, sf_down, sf_up);
                  PrintDiff();
                }

                EXPECT_EQ(ref_img_.frame_size, dst_img_.frame_size);
                EXPECT_EQ(0,
                          memcmp(ref_img_.buffer_alloc, dst_img_.buffer_alloc,
                                 ref_img_.frame_size));

                DeallocResizeImages();
              }
            }
          }
        }
      }
    }
  }